

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O0

void __thiscall KNNClassifier::KNNClassifier(KNNClassifier *this,uint n_neighbors)

{
  uint n_neighbors_local;
  KNNClassifier *this_local;
  
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&this->matrizX);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::Matrix(&this->matrizY);
  this->k = n_neighbors;
  return;
}

Assistant:

KNNClassifier::KNNClassifier(unsigned int n_neighbors)
{
  k = n_neighbors;
}